

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

void anon_unknown.dwarf_a1d406::MakeTreeRelative(aiNode *start,aiMatrix4x4 *combined)

{
  bool bVar1;
  aiMatrix4x4t<float> *this;
  uint local_dc;
  uint i;
  aiMatrix4x4t<float> local_98;
  undefined1 local_58 [8];
  aiMatrix4x4 old;
  aiMatrix4x4 *combined_local;
  aiNode *start_local;
  
  old._56_8_ = combined;
  memcpy(local_58,&start->mTransformation,0x40);
  bVar1 = aiMatrix4x4t<float>::IsIdentity((aiMatrix4x4t<float> *)old._56_8_);
  if (!bVar1) {
    memcpy(&stack0xffffffffffffff28,(void *)old._56_8_,0x40);
    this = aiMatrix4x4t<float>::Inverse((aiMatrix4x4t<float> *)&stack0xffffffffffffff28);
    aiMatrix4x4t<float>::operator*(&local_98,this,&start->mTransformation);
    memcpy(&start->mTransformation,&local_98,0x40);
  }
  for (local_dc = 0; local_dc < start->mNumChildren; local_dc = local_dc + 1) {
    MakeTreeRelative(start->mChildren[local_dc],(aiMatrix4x4 *)local_58);
  }
  return;
}

Assistant:

void MakeTreeRelative(aiNode* start, const aiMatrix4x4& combined)
{
    // combined is the parent's absolute transformation matrix
    const aiMatrix4x4 old = start->mTransformation;

    if (!combined.IsIdentity()) {
        start->mTransformation = aiMatrix4x4(combined).Inverse() * start->mTransformation;
    }

    // All nodes store absolute transformations right now, so we need to make them relative
    for (unsigned int i = 0; i < start->mNumChildren; ++i) {
        MakeTreeRelative(start->mChildren[i],old);
    }
}